

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall gl4cts::BasicBufferState::Run(BasicBufferState *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  long lVar2;
  GLenum access;
  Buffer buffer;
  Buffer local_70;
  
  deqp::GLWrapper::GLWrapper(&local_70.super_GLWrapper);
  local_70.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__Buffer_020c82f8;
  local_70.size_ = 0;
  local_70.usage_ = 0x88e4;
  local_70.access_ = 0x88ba;
  local_70.access_flags_ = 0;
  local_70.mapped_ = '\0';
  this_00 = &local_70.super_GLWrapper.super_CallLogWrapper;
  local_70.map_pointer_ = (void *)0x0;
  local_70.map_offset_ = 0;
  local_70.map_length_ = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&local_70.name_);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,local_70.name_);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,local_70.name_);
  lVar1 = gl4cts::anon_unknown_0::Buffer::Verify(&local_70);
  lVar2 = -1;
  if (lVar1 == 0) {
    local_70.size_ = 100;
    local_70.usage_ = 0x88ea;
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,100,(void *)0x0,0x88ea);
    lVar1 = gl4cts::anon_unknown_0::Buffer::Verify(&local_70);
    if (lVar1 == 0) {
      if (local_70.mapped_ != '\0') {
        __assert_fail("mapped_ == GL_FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderAtomicCountersTests.cpp"
                      ,0x30e,
                      "void *gl4cts::(anonymous namespace)::Buffer::MapRange(GLintptr, GLsizeiptr, GLbitfield)"
                     );
      }
      access = 0x92c0;
      local_70.map_pointer_ = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,10,0x32,2);
      if (local_70.map_pointer_ != (void *)0x0) {
        local_70.map_offset_ = 10;
        local_70.map_length_ = 0x32;
        local_70.access_ = 0x88b9;
        local_70.access_flags_ = 2;
        local_70.mapped_ = '\x01';
      }
      lVar1 = gl4cts::anon_unknown_0::Buffer::Verify(&local_70);
      if (lVar1 == 0) {
        gl4cts::anon_unknown_0::Buffer::Unmap(&local_70);
        lVar1 = gl4cts::anon_unknown_0::Buffer::Verify(&local_70);
        if (lVar1 == 0) {
          gl4cts::anon_unknown_0::Buffer::Map(&local_70,access);
          lVar1 = gl4cts::anon_unknown_0::Buffer::Verify(&local_70);
          if (lVar1 == 0) {
            gl4cts::anon_unknown_0::Buffer::Unmap(&local_70);
            lVar2 = gl4cts::anon_unknown_0::Buffer::Verify(&local_70);
            lVar2 = -(ulong)(lVar2 != 0);
          }
        }
      }
    }
  }
  gl4cts::anon_unknown_0::Buffer::~Buffer(&local_70);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		Buffer buffer;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer.name());

		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.Data(100, NULL, GL_DYNAMIC_COPY);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.MapRange(10, 50, GL_MAP_WRITE_BIT);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;
		buffer.Unmap();
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.Map(GL_READ_ONLY);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;
		buffer.Unmap();
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		return NO_ERROR;
	}